

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::SimpleFactory::getDisplayName
          (SimpleFactory *this,UnicodeString *id,Locale *param_2,UnicodeString *result)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  int len;
  bool bVar5;
  
  if (this->_visible != '\0') {
    uVar1 = (this->_id).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (this->_id).fUnion.fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (id->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar4 = (id->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar2 >> 5;
      }
      if ((((int)sVar2 & 1U) != 0) || (len != iVar4)) goto LAB_00326e05;
      UVar3 = icu_63::UnicodeString::doEquals(&this->_id,id,len);
      bVar5 = UVar3 != '\0';
    }
    else {
      bVar5 = (bool)(*(byte *)&id->fUnion & 1);
    }
    if (bVar5 != false) {
      icu_63::UnicodeString::operator=(result,&this->_id);
      return result;
    }
  }
LAB_00326e05:
  icu_63::UnicodeString::setToBogus(result);
  return result;
}

Assistant:

UnicodeString& 
SimpleFactory::getDisplayName(const UnicodeString& id, const Locale& /* locale */, UnicodeString& result) const 
{
    if (_visible && _id == id) {
        result = _id;
    } else {
        result.setToBogus();
    }
    return result;
}